

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v4_tests.cc
# Opt level: O3

void __thiscall
lf::io::test::lf_io_gmsh_file_v4_readTwoElementHybrid2d_Test::
~lf_io_gmsh_file_v4_readTwoElementHybrid2d_Test
          (lf_io_gmsh_file_v4_readTwoElementHybrid2d_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(lf_io_gmsh_file_v4, readTwoElementHybrid2d) {
  auto filename = test_utils::getMeshPath("two_element_hybrid_2d_v4.msh");
  auto mshfile = ReadGmshFile(filename);
  EXPECT_TRUE(std::holds_alternative<GMshFileV4>(mshfile));
  auto filev4 = std::get<GMshFileV4>(mshfile);
  EXPECT_FALSE(filev4.is_binary);
  checkTwoElementHybrid(filev4);
}